

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O2

bool __thiscall Clasp::ClaspFacade::SolveStrategy::Async::doWait(Async *this,double t)

{
  SafeIntType *pSVar1;
  __int_type _Var2;
  __int_type _Var3;
  bool bVar4;
  double local_38;
  unique_lock<std::mutex> lock;
  
  std::unique_lock<std::mutex>::unique_lock(&lock,&this->mqMutex_);
  local_38 = t;
LAB_0011ac54:
  do {
    if (((this->super_SolveStrategy).signal_.super___atomic_base<unsigned_int>._M_i == 0) ||
       (((this->super_SolveStrategy).state_.super___atomic_base<unsigned_int>._M_i & 3) == 0)) {
      _Var2 = (this->super_SolveStrategy).state_.super___atomic_base<unsigned_int>._M_i;
      if (_Var2 != 1) {
        std::unique_lock<std::mutex>::~unique_lock(&lock);
        pSVar1 = &(this->super_SolveStrategy).state_;
        LOCK();
        _Var3 = (pSVar1->super___atomic_base<unsigned_int>)._M_i;
        if (_Var3 == 10) {
          (pSVar1->super___atomic_base<unsigned_int>)._M_i = 2;
          _Var3 = 10;
        }
        UNLOCK();
        if (_Var3 == 4) {
          pSVar1 = &(this->super_SolveStrategy).state_;
          LOCK();
          bVar4 = (pSVar1->super___atomic_base<unsigned_int>)._M_i == 4;
          if (bVar4) {
            (pSVar1->super___atomic_base<unsigned_int>)._M_i = 0xc;
          }
          UNLOCK();
          if (bVar4) {
            std::thread::join();
          }
        }
        goto LAB_0011ace4;
      }
      if (0.0 <= local_38) break;
    }
    else {
      std::condition_variable::notify_all();
    }
    std::condition_variable::wait((unique_lock *)&this->mqCond_);
  } while( true );
  if (local_38 <= 0.0) {
    std::unique_lock<std::mutex>::~unique_lock(&lock);
LAB_0011ace4:
    return _Var2 != 1;
  }
  mt::condition_variable::wait_for(&this->mqCond_,&lock,local_38);
  local_38 = 0.0;
  goto LAB_0011ac54;
}

Assistant:

virtual bool doWait(double t) {
		for (mt::unique_lock<Clasp::mt::mutex> lock(mqMutex_);;) {
			if (signal() && running()) { // propagate signal to async thread and force wait
				mqCond_.notify_all();
				mqCond_.wait(lock);
			}
			else if (ready()) { break; }
			else if (t < 0.0) { mqCond_.wait(lock); }
			else if (t > 0.0) { mqCond_.wait_for(lock, t); t = 0.0; }
			else              { return false; }
		}
		assert(ready());
		// acknowledge current model or join if first to see done
		if (compare_and_swap(state_, uint32(state_next), uint32(state_model)) == state_done
			&& compare_and_swap(state_, uint32(state_done), uint32(state_join)) == state_done) {
			task_.join();
		}
		return true;
	}